

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMPLoader.cpp
# Opt level: O0

void __thiscall
Assimp::HMPImporter::CreateMaterial(HMPImporter *this,uchar *szCurrent,uchar **szCurrentOut)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  ulong uVar3;
  aiVector3t<float> *paVar4;
  aiMaterial *this_00;
  aiMaterial **ppaVar5;
  aiVector3t<float> *local_480;
  undefined1 local_45c [8];
  aiString szName;
  aiColor3D clr;
  aiMaterial *pcHelper;
  uchar *puStack_30;
  int iMode;
  Header_HMP5 *pcHeader;
  aiMesh *pcMesh;
  uchar **szCurrentOut_local;
  uchar *szCurrent_local;
  HMPImporter *this_local;
  
  pcHeader = (Header_HMP5 *)*((this->super_MDLImporter).pScene)->mMeshes;
  puStack_30 = (this->super_MDLImporter).mBuffer;
  pcMesh = (aiMesh *)szCurrentOut;
  szCurrentOut_local = (uchar **)szCurrent;
  szCurrent_local = (uchar *)this;
  if (*(int *)(puStack_30 + 0x30) == 0) {
    pcHelper._4_4_ = 2;
    this_00 = (aiMaterial *)operator_new(0x10);
    aiMaterial::aiMaterial(this_00);
    aiMaterial::AddProperty<int>(this_00,(int *)((long)&pcHelper + 4),1,"$mat.shadingm",0,0);
    aiColor3D::aiColor3D((aiColor3D *)(szName.data + 0x3f8));
    szName.data[0x3f8] = -0x66;
    szName.data[0x3f9] = -0x67;
    szName.data[0x3fa] = '\x19';
    szName.data[0x3fb] = '?';
    szName.data[0x3fc] = -0x66;
    szName.data[0x3fd] = -0x67;
    szName.data[0x3fe] = '\x19';
    szName.data[0x3ff] = '?';
    aiMaterial::AddProperty<aiColor3D>
              (this_00,(aiColor3D *)(szName.data + 0x3f8),1,"$clr.diffuse",0,0);
    aiMaterial::AddProperty<aiColor3D>
              (this_00,(aiColor3D *)(szName.data + 0x3f8),1,"$clr.specular",0,0);
    szName.data[0x3f8] = -0x33;
    szName.data[0x3f9] = -0x34;
    szName.data[0x3fa] = 'L';
    szName.data[0x3fb] = '=';
    szName.data[0x3fc] = -0x33;
    szName.data[0x3fd] = -0x34;
    szName.data[0x3fe] = 'L';
    szName.data[0x3ff] = '=';
    aiMaterial::AddProperty<aiColor3D>
              (this_00,(aiColor3D *)(szName.data + 0x3f8),1,"$clr.ambient",0,0);
    aiString::aiString((aiString *)local_45c);
    aiString::Set((aiString *)local_45c,"DefaultMaterial");
    aiMaterial::AddProperty(this_00,(aiString *)local_45c,"?mat.name",0,0);
    ((this->super_MDLImporter).pScene)->mNumMaterials = 1;
    ppaVar5 = (aiMaterial **)operator_new__(8);
    ((this->super_MDLImporter).pScene)->mMaterials = ppaVar5;
    *((this->super_MDLImporter).pScene)->mMaterials = this_00;
  }
  else {
    uVar2 = (ulong)*(int *)(puStack_30 + 0x3c);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar2;
    uVar3 = SUB168(auVar1 * ZEXT816(0xc),0);
    if (SUB168(auVar1 * ZEXT816(0xc),8) != 0) {
      uVar3 = 0xffffffffffffffff;
    }
    paVar4 = (aiVector3t<float> *)operator_new__(uVar3);
    if (uVar2 != 0) {
      local_480 = paVar4;
      do {
        aiVector3t<float>::aiVector3t(local_480);
        local_480 = local_480 + 1;
      } while (local_480 != paVar4 + uVar2);
    }
    *(aiVector3t<float> **)(pcHeader[1].scale_origin + 2) = paVar4;
    pcHeader[2].scale[0] = 2.8026e-45;
    ReadFirstSkin(this,*(uint *)(puStack_30 + 0x30),(uchar *)szCurrentOut_local,
                  (uchar **)&szCurrentOut_local);
  }
  *(uchar ***)pcMesh = szCurrentOut_local;
  return;
}

Assistant:

void HMPImporter::CreateMaterial(const unsigned char* szCurrent,
    const unsigned char** szCurrentOut)
{
    aiMesh* const pcMesh = pScene->mMeshes[0];
    const HMP::Header_HMP5* const pcHeader = (const HMP::Header_HMP5*)mBuffer;

    // we don't need to generate texture coordinates if
    // we have no textures in the file ...
    if (pcHeader->numskins)
    {
        pcMesh->mTextureCoords[0] = new aiVector3D[pcHeader->numverts];
        pcMesh->mNumUVComponents[0] = 2;

        // now read the first skin and skip all others
        ReadFirstSkin(pcHeader->numskins,szCurrent,&szCurrent);
    }
    else
    {
        // generate a default material
        const int iMode = (int)aiShadingMode_Gouraud;
        aiMaterial* pcHelper = new aiMaterial();
        pcHelper->AddProperty<int>(&iMode, 1, AI_MATKEY_SHADING_MODEL);

        aiColor3D clr;
        clr.b = clr.g = clr.r = 0.6f;
        pcHelper->AddProperty<aiColor3D>(&clr, 1,AI_MATKEY_COLOR_DIFFUSE);
        pcHelper->AddProperty<aiColor3D>(&clr, 1,AI_MATKEY_COLOR_SPECULAR);

        clr.b = clr.g = clr.r = 0.05f;
        pcHelper->AddProperty<aiColor3D>(&clr, 1,AI_MATKEY_COLOR_AMBIENT);

        aiString szName;
        szName.Set(AI_DEFAULT_MATERIAL_NAME);
        pcHelper->AddProperty(&szName,AI_MATKEY_NAME);

        // add the material to the scene
        pScene->mNumMaterials = 1;
        pScene->mMaterials = new aiMaterial*[1];
        pScene->mMaterials[0] = pcHelper;
    }
    *szCurrentOut = szCurrent;
}